

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O0

TermList __thiscall
Kernel::MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_>::denormalize
          (MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *this)

{
  TermList TVar1;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff18;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff20;
  Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
  *x;
  AnyPoly *in_stack_ffffffffffffff30;
  AnyPoly *in_stack_ffffffffffffff38;
  PolyNf *in_stack_ffffffffffffff40;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff58;
  MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff88;
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffff90;
  Monom *in_stack_ffffffffffffffd8;
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *in_stack_ffffffffffffffe0;
  
  x = (Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>
       *)&stack0xffffffffffffff40;
  MonomFactors(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::Monom
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::Polynom
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  Lib::
  perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>
            (in_stack_ffffffffffffff58);
  AnyPoly::AnyPoly<Kernel::NumTraits<Kernel::RealConstantType>>(in_stack_ffffffffffffff30,x);
  PolyNf::PolyNf(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  TVar1 = PolyNf::denormalize((PolyNf *)in_stack_ffffffffffffff58);
  Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Polynom
            ((Polynom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x379a85);
  Monom<Kernel::NumTraits<Kernel::RealConstantType>_>::~Monom
            ((Monom<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x379a8f);
  ~MonomFactors((MonomFactors<Kernel::NumTraits<Kernel::RealConstantType>_> *)0x379a99);
  return (TermList)TVar1._content;
}

Assistant:

TermList MonomFactors<Number>::denormalize()  const
{
  return PolyNf(AnyPoly(perfect(Polynom(Monom(MonomFactors(*this)))))).denormalize(); 
}